

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

void print_ops(void)

{
  bool bVar1;
  bool bVar2;
  u32 uVar3;
  uint uVar4;
  u32 *puVar5;
  u32 *puVar6;
  long lVar7;
  uint uVar8;
  char *__format;
  uint uVar9;
  ulong uVar10;
  char mnemonic [100];
  U32Pair pairs [512];
  
  puVar5 = emulator_get_opcode_count();
  puVar6 = emulator_get_cb_opcode_count();
  memset(pairs,0,0x1000);
  uVar3 = 0xcb00;
  for (uVar10 = 0; uVar10 < 0x200; uVar10 = uVar10 + 2) {
    pairs[uVar10].value = uVar3 - 0xcb00;
    pairs[uVar10].count = *(u32 *)((long)puVar5 + uVar10 * 2);
    pairs[uVar10 + 1].value = uVar3;
    pairs[uVar10 + 1].count = *(u32 *)((long)puVar6 + uVar10 * 2);
    uVar3 = uVar3 + 1;
  }
  qsort(pairs,0x200,8,compare_pair);
  puts("  op:      count -   mnemonic");
  puts("--------------------------------");
  uVar10 = 0;
  lVar7 = 0;
  uVar8 = 0;
  bVar1 = false;
  do {
    if (uVar10 == 0x200) {
      if (bVar1) {
        puts("  ...");
      }
      printf("distinct: %d\n",(ulong)uVar8);
      printf("total: %lu\n",lVar7);
      return;
    }
    uVar4 = pairs[uVar10].count;
    if (uVar4 != 0) {
      bVar2 = true;
      if (uVar10 < s_print_ops_limit) {
        uVar4 = pairs[uVar10].value;
        uVar9 = uVar4 & 0xffff;
        if (uVar9 == 0xcb) goto LAB_001162df;
        __format = "%04x";
        if (uVar9 < 0x100) {
          __format = "  %02x";
        }
        printf(__format,(ulong)uVar9);
        emulator_get_opcode_mnemonic((u16)uVar4,mnemonic,100);
        printf(": %10d - %s\n",(ulong)pairs[uVar10].count,mnemonic);
        uVar4 = pairs[uVar10].count;
        bVar2 = bVar1;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + (ulong)uVar4;
      bVar1 = bVar2;
    }
LAB_001162df:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void print_ops(void) {
  u32* opcode_count = emulator_get_opcode_count();
  u32* cb_opcode_count = emulator_get_cb_opcode_count();

  U32Pair pairs[512];
  ZERO_MEMORY(pairs);

  u32 i;
  for (i = 0; i < 512; i += 2) {
    u8 op = i / 2;
    pairs[i].value = op;
    pairs[i].count = opcode_count[op];
    pairs[i + 1].value = 0xcb00 | op;
    pairs[i + 1].count = cb_opcode_count[op];
  }

  qsort(pairs, ARRAY_SIZE(pairs), sizeof(pairs[0]), compare_pair);

  printf("  op:      count -   mnemonic\n");
  printf("--------------------------------\n");
  char mnemonic[100];
  u64 total = 0;
  int distinct = 0;
  Bool skipped = FALSE;
  for (i = 0; i < 512; ++i) {
    if (pairs[i].count > 0) {
      u16 opcode = pairs[i].value;
      if (i < s_print_ops_limit) {
        if (opcode == 0xcb) continue;
        if (opcode < 0x100) {
          printf("  %02x", opcode);
        } else {
          printf("%04x", opcode);
        }
        emulator_get_opcode_mnemonic(opcode, mnemonic, sizeof(mnemonic));
        printf(": %10d - %s\n", pairs[i].count, mnemonic);
      } else {
        skipped = TRUE;
      }
      ++distinct;
      total += pairs[i].count;
    }
  }
  if (skipped) {
    printf("  ...\n");
  }
  printf("distinct: %d\n", distinct);
  printf("total: %" PRIu64 "\n", total);
}